

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

bool __thiscall
Sudoku::rowCheck(Sudoku *this,
                list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields
                ,bool recordFullFurtherWays,bool debug)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int i;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint local_70;
  Way local_50;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  iVar4 = this->squared_size_;
  uVar6 = 0;
  local_38 = furtherWays_;
  if (0 < iVar4) {
    do {
      if (0 < iVar4) {
        i = 1;
        do {
          if (0 < iVar4) {
            uVar10 = 0;
            local_70 = 0;
            uVar8 = 0;
            do {
              (*this->_vptr_Sudoku[7])(this,uVar10,(ulong)uVar6);
              iVar4 = (*this->_vptr_Sudoku[7])(this,uVar10,(ulong)uVar6);
              iVar4 = Field::value((testFields->
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar4].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (iVar4 == i) goto LAB_0010c4ee;
              iVar5 = (*this->_vptr_Sudoku[7])(this,uVar10,(ulong)uVar6);
              bVar3 = Field::valuePossible
                                ((testFields->
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar5].
                                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
              uVar8 = uVar8 + bVar3;
              if (bVar3) {
                local_70 = (uint)uVar10;
              }
            } while ((uVar8 < 2) &&
                    (uVar9 = (uint)uVar10 + 1, uVar10 = (ulong)uVar9,
                    (int)uVar9 < this->squared_size_));
            if ((iVar4 != i) && (uVar8 == 1)) {
              if (debug) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  Row check (row ",0x11);
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): value ",9);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,i);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," has to be in field (",0x15);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_70);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->current_z_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
              p_Var2 = (local_38->
                       super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                       _M_impl._M_node.super__List_node_base._M_prev;
              p_Var1 = p_Var2 + 1;
              *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + 1;
              local_50.index = (*this->_vptr_Sudoku[7])(this,(ulong)local_70,(ulong)uVar6);
              local_50.posZ = this->current_z_;
              local_50.reason = onlyPositionInRow;
              local_50.posX = local_70;
              local_50.posY = uVar6;
              local_50.value = i;
              std::
              _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
              ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                        ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                          *)&p_Var2[2]._M_prev,&local_50);
              if (!recordFullFurtherWays) {
                iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)local_70,(ulong)uVar6);
                Field::setValue((testFields->
                                super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[iVar4].
                                super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
                uVar6 = 1;
                goto LAB_0010c53a;
              }
            }
          }
LAB_0010c4ee:
          iVar4 = this->squared_size_;
          bVar3 = i < iVar4;
          i = i + 1;
        } while (bVar3);
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < iVar4);
    uVar6 = 0;
  }
LAB_0010c53a:
  return SUB41(uVar6,0);
}

Assistant:

bool Sudoku::rowCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check rows, if there are values that can only be at one position
  restart = false;

  // loop over rows
  for (int y = 0; y < squared_size_; y++)
  {
    // loop over all values
    for (int value = 1; value <= squared_size_; value++)
    {
      // check if value is already set (valueIsAlreadySet),
      // or can only be at exactly one position in this row (nPossiblePositionsForValue==1), then it is position positionX
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionX = 0;

      // loop over fields in row
      for (int x = 0; x < squared_size_; x++)
      {
        int i = index(x,y);
        int si = testFields.size();
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionX = x;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"  Row check (row "<<y<<"): value "<<value<<" has to be in field ("<<positionX<<","<<y<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nRowCheckMatches++;    // increment number of occurences that a value can only be at one position in a row
        furtherWays_.back().addWay(index(positionX,y), positionX, y, current_z_, value, FurtherWays::Reason::onlyPositionInRow);

        if(!recordFullFurtherWays)
        {
          testFields[index(positionX,y)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}